

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

char * __thiscall format_iter::next(format_iter *this,size_t *len)

{
  vm_val_t *this_00;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ushort *puVar4;
  vm_val_t ele;
  vm_val_t local_38;
  vm_val_t local_28;
  
  *len = 0;
  if (this->mode != 0) goto LAB_00257079;
  while( true ) {
    if (this->custom_cnt <= this->cidx) {
      return (char *)0x0;
    }
    iVar1 = vm_val_t::is_listlike(this->custom);
    this_00 = this->custom;
    if (iVar1 == 0) break;
    sVar2 = this->cidx + 1;
    this->cidx = sVar2;
    local_28.typ = VM_INT;
    local_28.val.obj = (vm_obj_id_t)sVar2;
    vm_val_t::ll_index(this_00,&local_38,&local_28);
    if (local_38.typ != VM_NIL) goto LAB_002570b9;
    this->mode = 1;
LAB_00257079:
    if (this->bidx < this->builtin_cnt) {
      sVar3 = strlen(this->builtin[this->bidx]);
      *len = sVar3;
      sVar2 = this->bidx;
      this->bidx = sVar2 + 1;
      return this->builtin[sVar2];
    }
    this->mode = 0;
  }
  local_38.typ = this_00->typ;
  local_38._4_4_ = *(undefined4 *)&this_00->field_0x4;
  local_38.val = this_00->val;
LAB_002570b9:
  puVar4 = (ushort *)vm_val_t::get_as_string(&local_38);
  if (puVar4 == (ushort *)0x0) {
    return (char *)0x0;
  }
  *len = (ulong)*puVar4;
  return (char *)(puVar4 + 1);
}

Assistant:

const char *next(VMG_ size_t &len)
    {
        /* assume we won't find anythign */
        len = 0;

        /* keep going until we find something */
        for (;;)
        {
            if (mode == 0)
            {
                /* custom list - if exhausted, we're done */
                if (cidx >= custom_cnt)
                    return 0;

                /* get the next custom item, according to the source type */
                vm_val_t ele;
                if (custom->is_listlike(vmg0_))
                {
                    /* get the next list element */
                    custom->ll_index(vmg_ &ele, ++cidx);

                    /* if it's nil, switch to the builtin list */
                    if (ele.typ == VM_NIL)
                    {
                        mode = 1;
                        continue;
                    }
                }
                else
                {
                    /* it must be a single string */
                    ele = *custom;
                }

                /* retrieve the string value */
                const char *str = ele.get_as_string(vmg0_);
                if (str != 0)
                {
                    len = vmb_get_len(str);
                    str += VMB_LEN;
                }
                return str;
            }
            else
            {
                /* builtin list - if exhausted, return to the custom list */
                if (bidx >= builtin_cnt)
                {
                    mode = 0;
                    continue;
                }

                /* return the next builtin item */
                len = strlen(builtin[bidx]);
                return builtin[bidx++];
            }
        }
    }